

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
::Action(Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
         *this,ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
               *impl)

{
  __shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>,void>
            (local_20,impl);
  std::function<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>::
  function<testing::Action<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>::ActionAdapter,void>
            ((function<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>
              *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}